

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O3

UWORD32 ihevcd_uev(bitstrm_t *ps_bitstrm)

{
  UWORD32 UVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  UWORD32 UVar5;
  uint uVar6;
  uint uVar7;
  
  UVar1 = ps_bitstrm->u4_bit_ofst;
  UVar5 = ps_bitstrm->u4_cur_word;
  uVar4 = 0x20;
  uVar7 = 0;
  if (0x20 - UVar1 < 0x20) {
    uVar7 = ps_bitstrm->u4_nxt_word >> ((byte)(0x20 - UVar1) & 0x1f);
  }
  uVar7 = uVar7 | UVar5 << ((byte)UVar1 & 0x1f);
  if (uVar7 != 0) {
    uVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  uVar7 = UVar1 + uVar4 + 1;
  ps_bitstrm->u4_bit_ofst = uVar7;
  if (0x1f < uVar7) {
    UVar5 = ps_bitstrm->u4_nxt_word;
    ps_bitstrm->u4_cur_word = UVar5;
    puVar2 = ps_bitstrm->pu4_buf;
    ps_bitstrm->pu4_buf = puVar2 + 1;
    uVar6 = *puVar2;
    uVar7 = (UVar1 + uVar4) - 0x1f;
    ps_bitstrm->u4_bit_ofst = uVar7;
    ps_bitstrm->u4_nxt_word =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  }
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (UVar5 << ((byte)uVar7 & 0x1f)) >> (-(byte)uVar4 & 0x1f);
    uVar7 = uVar7 + uVar4;
    ps_bitstrm->u4_bit_ofst = uVar7;
    if (uVar7 < 0x21) {
      if (uVar7 != 0x20) goto LAB_0010f735;
    }
    else {
      uVar3 = 0;
      if (0x40 - uVar7 < 0x20) {
        uVar3 = ps_bitstrm->u4_nxt_word >> ((byte)(0x40 - uVar7) & 0x1f);
      }
      uVar6 = uVar6 | uVar3;
    }
    ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
    puVar2 = ps_bitstrm->pu4_buf;
    ps_bitstrm->pu4_buf = puVar2 + 1;
    uVar3 = *puVar2;
    ps_bitstrm->u4_bit_ofst = uVar7 - 0x20;
    ps_bitstrm->u4_nxt_word =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
LAB_0010f735:
  return ~(-1 << ((byte)uVar4 & 0x1f)) + uVar6;
}

Assistant:

UWORD32 ihevcd_uev(bitstrm_t *ps_bitstrm)
{
    UWORD32 u4_bits_read;
    UWORD32 u4_clz;


    /***************************************************************/
    /* Find leading zeros in next 32 bits                          */
    /***************************************************************/
    BITS_NXT32(u4_bits_read,
               ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word);


    u4_clz = CLZ(u4_bits_read);

    BITS_FLUSH(ps_bitstrm->pu4_buf,
               ps_bitstrm->u4_bit_ofst,
               ps_bitstrm->u4_cur_word,
               ps_bitstrm->u4_nxt_word,
               (u4_clz + 1));

    u4_bits_read = 0;
    if(u4_clz)
    {
        BITS_GET(u4_bits_read,
                 ps_bitstrm->pu4_buf,
                 ps_bitstrm->u4_bit_ofst,
                 ps_bitstrm->u4_cur_word,
                 ps_bitstrm->u4_nxt_word,
                 u4_clz);
    }
    return ((1 << u4_clz) + u4_bits_read - 1);

}